

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_inline_array(void)

{
  byte bVar1;
  int32_t iVar2;
  int32_t iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int32_t *piVar6;
  undefined8 uVar7;
  int32_t *piVar8;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar9;
  bson_t *bcon;
  int32_t b;
  int32_t a;
  
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar4 = bson_bcon_magic();
  iVar2 = bcon_ensure_int32(1);
  uVar5 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(2);
  uVar4 = bcon_new(0,"foo","[",uVar4,0xf,iVar2,uVar5,0xf,CONCAT44(uVar9,iVar3),"]",0);
  uVar5 = bson_bcone_magic();
  piVar6 = bcon_ensure_int32_ptr((int32_t *)((long)&bcon + 4));
  uVar7 = bson_bcone_magic();
  piVar8 = bcon_ensure_int32_ptr((int32_t *)&bcon);
  bVar1 = bcon_extract(uVar4,"foo","[",uVar5,0xf,piVar6,uVar7,0xf,piVar8,"]",0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x154,"test_inline_array",
            "BCON_EXTRACT (bcon, \"foo\", \"[\", BCONE_INT32 (a), BCONE_INT32 (b), \"]\")");
    abort();
  }
  if (bcon._4_4_ != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x156,"test_inline_array","a == 1");
    abort();
  }
  if ((int)bcon != 2) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x157,"test_inline_array","b == 2");
    abort();
  }
  bson_destroy(uVar4);
  return;
}

Assistant:

static void
test_inline_array (void)
{
   bson_t bcon, expected, child;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);

   bson_append_utf8 (&child, "0", -1, "baz", -1);
   bson_append_array (&expected, "foo", -1, &child);

   BCON_APPEND (&bcon, "foo", "[", "baz", "]");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&child);
   bson_destroy (&expected);
}